

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatcherDescriberInterface *
testing::internal::MatcherBase<unsigned_long*>::
GetDescriberImpl<testing::internal::MatcherBase<unsigned_long*>::ValuePolicy<testing::internal::AnythingMatcher,true>>
          (MatcherBase<unsigned_long_*> *m)

{
  __tuple_element_t<0UL,_tuple<const_MatcherBase<unsigned_long_*>_*,_const_AnythingMatcher_*>_>
  *ppMVar1;
  MatcherBase<unsigned_long_*> *local_28;
  tuple<const_testing::internal::MatcherBase<unsigned_long_*>_*,_const_testing::internal::AnythingMatcher_*>
  local_20;
  MatcherBase<unsigned_long_*> *local_10;
  MatcherBase<unsigned_long_*> *m_local;
  
  local_28 = m;
  local_10 = m;
  MatcherBase<unsigned_long_*>::ValuePolicy<testing::internal::AnythingMatcher,_true>::Get(m);
  std::
  make_tuple<testing::internal::MatcherBase<unsigned_long*>const*,testing::internal::AnythingMatcher_const*>
            ((MatcherBase<unsigned_long_*> **)&local_20,(AnythingMatcher **)&local_28);
  ppMVar1 = std::
            get<0ul,testing::internal::MatcherBase<unsigned_long*>const*,testing::internal::AnythingMatcher_const*>
                      (&local_20);
  return &(*ppMVar1)->super_MatcherDescriberInterface;
}

Assistant:

static const MatcherDescriberInterface* GetDescriberImpl(
      const MatcherBase& m) {
    // If the impl is a MatcherDescriberInterface, then return it.
    // Otherwise use MatcherBase itself.
    // This allows us to implement the GetDescriber() function without support
    // from the impl, but some users really want to get their impl back when
    // they call GetDescriber().
    // We use std::get on a tuple as a workaround of not having `if constexpr`.
    return std::get<(
        std::is_convertible<decltype(&P::Get(m)),
                            const MatcherDescriberInterface*>::value
            ? 1
            : 0)>(std::make_tuple(&m, &P::Get(m)));
  }